

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buffer,QSpanData *data,int y,int x,int length)

{
  uint *puVar1;
  uint uVar2;
  uchar *puVar3;
  long lVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  uint *b;
  int iVar12;
  int iVar13;
  int iVar14;
  double dVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dStack_90;
  double dStack_40;
  
  dVar8 = (double)x + 0.5;
  dVar21 = (double)y + 0.5;
  if ((data->field_0x8a & 1) != 0) {
    dVar17 = (data->m21 * dVar21 + dVar8 * data->m11 + data->dx) * 65536.0;
    dVar19 = (data->m22 * dVar21 + dVar8 * data->m12 + data->dy) * 65536.0;
    dVar15 = dVar19;
    if (dVar17 <= dVar19) {
      dVar15 = dVar17;
    }
    dVar6 = data->m11 * 65536.0;
    dVar20 = data->m12 * 65536.0;
    auVar5._8_4_ = SUB84(dVar20,0);
    auVar5._0_8_ = dVar6;
    auVar5._12_4_ = (int)((ulong)dVar20 >> 0x20);
    dVar6 = trunc(dVar6);
    dStack_40 = auVar5._8_8_;
    dVar20 = trunc(dStack_40);
    dVar18 = (double)length * dVar6 + dVar17;
    dVar20 = (double)length * dVar20 + dVar19;
    dVar6 = dVar20;
    if (dVar18 <= dVar20) {
      dVar6 = dVar18;
    }
    if (dVar15 <= dVar6) {
      dVar6 = dVar15;
    }
    if (-2147483648.0 <= dVar6) {
      if (dVar19 <= dVar17) {
        dVar19 = dVar17;
      }
      if (dVar20 <= dVar18) {
        dVar20 = dVar18;
      }
      if (dVar20 <= dVar19) {
        dVar20 = dVar19;
      }
      if (dVar20 <= 2147483647.0) {
        iVar12 = (int)(data->m11 * 65536.0);
        iVar13 = (int)(data->m12 * 65536.0);
        iVar14 = (int)((data->m21 * dVar21 + dVar8 * data->m11 + data->dx) * 65536.0);
        iVar16 = (int)((data->m22 * dVar21 + dVar8 * data->m12 + data->dy) * 65536.0);
        if (iVar13 != 0) {
          if (length < 1) {
            return;
          }
          puVar3 = (data->field_23).texture.imageData;
          lVar4 = (data->field_23).texture.bytesPerLine;
          uVar11 = 0;
          do {
            iVar10 = iVar14 >> 0x10;
            uVar2 = (data->field_23).texture.width;
            if (iVar10 < 0 || (int)uVar2 <= iVar10) {
              iVar10 = (iVar10 % (int)uVar2 >> 0x1f & uVar2) + iVar10 % (int)uVar2;
            }
            iVar9 = iVar16 >> 0x10;
            uVar2 = (data->field_23).texture.height;
            if (iVar9 < 0 || (int)uVar2 <= iVar9) {
              iVar9 = (iVar9 % (int)uVar2 >> 0x1f & uVar2) + iVar9 % (int)uVar2;
            }
            buffer[uVar11] = *(uint *)(puVar3 + (long)iVar10 * 4 + iVar9 * lVar4);
            iVar14 = iVar14 + iVar12;
            iVar16 = iVar16 + iVar13;
            uVar11 = uVar11 + 1;
          } while ((uint)length != uVar11);
          return;
        }
        iVar16 = iVar16 >> 0x10;
        uVar2 = (data->field_23).texture.height;
        if (iVar16 < 0 || (int)uVar2 <= iVar16) {
          iVar16 = (iVar16 % (int)uVar2 >> 0x1f & uVar2) + iVar16 % (int)uVar2;
        }
        if (length < 1) {
          return;
        }
        lVar4 = (data->field_23).texture.bytesPerLine;
        puVar3 = (data->field_23).texture.imageData;
        uVar11 = 0;
        do {
          iVar13 = iVar14 >> 0x10;
          uVar2 = (data->field_23).texture.width;
          if (iVar13 < 0 || (int)uVar2 <= iVar13) {
            iVar13 = (iVar13 % (int)uVar2 >> 0x1f & uVar2) + iVar13 % (int)uVar2;
          }
          buffer[uVar11] = *(uint *)(puVar3 + (long)iVar13 * 4 + iVar16 * lVar4);
          iVar14 = iVar14 + iVar12;
          uVar11 = uVar11 + 1;
        } while ((uint)length != uVar11);
        return;
      }
    }
  }
  if (0 < length) {
    dVar17 = data->m11;
    dVar6 = data->m12;
    dVar19 = data->m13;
    puVar1 = buffer + length;
    dVar20 = data->m23 * dVar21 + dVar8 * dVar19 + data->m33;
    dVar15 = data->dx + data->m21 * dVar21 + dVar8 * dVar17;
    dStack_90 = data->dy + data->m22 * dVar21 + dVar8 * dVar6;
    puVar3 = (data->field_23).texture.imageData;
    lVar4 = (data->field_23).texture.bytesPerLine;
    do {
      dVar21 = (double)(-(ulong)(dVar20 == 0.0) & 0x3ff0000000000000 |
                       ~-(ulong)(dVar20 == 0.0) & (ulong)(1.0 / dVar20));
      auVar7._8_4_ = SUB84(dStack_90,0);
      auVar7._0_8_ = dVar15;
      auVar7._12_4_ = (int)((ulong)dStack_90 >> 0x20);
      dVar8 = floor(dVar15 * dVar21);
      dVar21 = floor(dStack_90 * dVar21);
      iVar16 = (int)dVar21;
      uVar2 = (data->field_23).texture.height;
      if (iVar16 < 0 || (int)uVar2 <= iVar16) {
        iVar16 = (iVar16 % (int)uVar2 >> 0x1f & uVar2) + iVar16 % (int)uVar2;
      }
      iVar14 = (int)dVar8;
      uVar2 = (data->field_23).texture.width;
      dStack_90 = auVar7._8_8_;
      if (iVar14 < 0 || (int)uVar2 <= iVar14) {
        iVar14 = (iVar14 % (int)uVar2 >> 0x1f & uVar2) + iVar14 % (int)uVar2;
      }
      *buffer = *(uint *)(puVar3 + (long)iVar14 * 4 + iVar16 * lVar4);
      dVar15 = dVar15 + dVar17;
      dStack_90 = dStack_90 + dVar6;
      dVar20 = dVar20 + dVar19;
      dVar20 = (double)((ulong)dVar20 & -(ulong)(dVar20 != 0.0) |
                       ~-(ulong)(dVar20 != 0.0) & (ulong)(dVar19 + dVar20));
      buffer = buffer + 1;
    } while (buffer < puVar1);
  }
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformed_fetcher(T *buffer, const QSpanData *data,
                                                 int y, int x, int length)
{
    static_assert(blendType == BlendTransformed || blendType == BlendTransformedTiled);
    const QTextureData &image = data->texture;

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    constexpr bool useFetch = (bpp < QPixelLayout::BPP32) && sizeof(T) == sizeof(uint);
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (!useFetch)
        Q_ASSERT(layout->bpp == bpp || (layout->bpp == QPixelLayout::BPP16FPx4 && bpp == QPixelLayout::BPP64));
    // When templated 'fetch' should be inlined at compile time:
    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout->bpp] : Fetch1PixelFunc(fetch1Pixel<bpp>);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        if (fdy == 0) { // simple scale, no rotation or shear
            int py = (fy >> 16);
            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            const uchar *src = image.scanLine(py);

            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int x2 = x1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    if (x1 == x2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[x1];
                    fx += fdx;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[px];
                    fx += fdx;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                if constexpr (useFetch)
                    buffer[i] = fetch1(src, px);
                else
                    buffer[i] = reinterpret_cast<const T*>(src)[px];
                fx += fdx;
            }
        } else { // rotation or shear
            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));
                if (fdy > 0)
                    fastLen = qMin(fastLen, int((qint64(image.y2 - 1) * fixed_scale - fy) / fdy));
                else if (fdy < 0)
                    fastLen = qMin(fastLen, int((qint64(image.y1) * fixed_scale - fy) / fdy));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int y1 = (fy >> 16);
                    int x2 = x1;
                    int y2 = y1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1);
                    if (x1 == x2 && y1 == y2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(y1), x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(y1))[x1];
                    fx += fdx;
                    fy += fdy;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    int py = (fy >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(py), px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                    fx += fdx;
                    fy += fdy;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                int py = (fy >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
                if constexpr (useFetch)
                    buffer[i] = fetch1(image.scanLine(py), px);
                else
                    buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                fx += fdx;
                fy += fdy;
            }
        }
    } else {
        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        T *const end = buffer + length;
        T *b = buffer;
        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal tx = fx * iw;
            const qreal ty = fy * iw;
            int px = qFloor(tx);
            int py = qFloor(ty);

            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
            if constexpr (useFetch)
                *b = fetch1(image.scanLine(py), px);
            else
                *b = reinterpret_cast<const T*>(image.scanLine(py))[px];

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }
}